

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collapse_unit_test.cpp
# Opt level: O2

void __thiscall collapse_from_array::test_method(collapse_from_array *this)

{
  ostream *poVar1;
  initializer_list<std::tuple<short,_short,_float>_> __l;
  allocator_type local_61;
  _Vector_base<std::tuple<short,_short,_float>,_std::allocator<std::tuple<short,_short,_float>_>_>
  local_60;
  _Tuple_impl<1UL,_short,_float> local_48;
  array<std::tuple<short,_short,_float>,_6UL> f_edge_array;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"***** COLLAPSE FROM ARRAY *****");
  std::endl<char,std::char_traits<char>>(poVar1);
  f_edge_array._M_elems[0].super__Tuple_impl<0UL,_short,_short,_float>.
  super__Tuple_impl<1UL,_short,_float> =
       (_Tuple_impl<0UL,_short,_short,_float>)(_Tuple_impl<1UL,_short,_float>)0x13f800000;
  f_edge_array._M_elems[1].super__Tuple_impl<0UL,_short,_short,_float>.
  super__Tuple_impl<1UL,_short,_float> =
       (_Tuple_impl<0UL,_short,_short,_float>)(_Tuple_impl<1UL,_short,_float>)0x100023f800000;
  f_edge_array._M_elems[2].super__Tuple_impl<0UL,_short,_short,_float>.
  super__Tuple_impl<1UL,_short,_float> =
       (_Tuple_impl<0UL,_short,_short,_float>)(_Tuple_impl<1UL,_short,_float>)0x200033f800000;
  f_edge_array._M_elems[3].super__Tuple_impl<0UL,_short,_short,_float>.
  super__Tuple_impl<1UL,_short,_float> =
       (_Tuple_impl<0UL,_short,_short,_float>)(_Tuple_impl<1UL,_short,_float>)0x300003f800000;
  f_edge_array._M_elems[4].super__Tuple_impl<0UL,_short,_short,_float>.
  super__Tuple_impl<1UL,_short,_float> =
       (_Tuple_impl<0UL,_short,_short,_float>)(_Tuple_impl<1UL,_short,_float>)0x240000000;
  f_edge_array._M_elems[5].super__Tuple_impl<0UL,_short,_short,_float>.
  super__Tuple_impl<1UL,_short,_float> =
       (_Tuple_impl<0UL,_short,_short,_float>)(_Tuple_impl<1UL,_short,_float>)0x1000340066666;
  local_48.super__Tuple_impl<2UL,_float>.super__Head_base<2UL,_float,_false>._M_head_impl =
       (_Head_base<2UL,_float,_false>)0x40066666;
  local_48.super__Head_base<1UL,_short,_false>._M_head_impl = 3;
  local_48._6_2_ = 1;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_48;
  std::vector<std::tuple<short,_short,_float>,_std::allocator<std::tuple<short,_short,_float>_>_>::
  vector((vector<std::tuple<short,_short,_float>,_std::allocator<std::tuple<short,_short,_float>_>_>
          *)&local_60,__l,&local_61);
  trace_and_check_collapse<std::array<std::tuple<short,short,float>,6ul>>
            (&f_edge_array,(Filtered_edge_list *)&local_60);
  std::
  _Vector_base<std::tuple<short,_short,_float>,_std::allocator<std::tuple<short,_short,_float>_>_>::
  ~_Vector_base(&local_60);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(collapse_from_array) {
  std::cout << "***** COLLAPSE FROM ARRAY *****" << std::endl;
  //  1   2
  //  o---o
  //  |\ /|
  //  | x |
  //  |/ \|
  //  o---o
  //  0   3
  std::array<Filtered_edge, 6> f_edge_array = {{{0, 1, 1.},
                                                {1, 2, 1.},
                                                {2, 3, 1.},
                                                {3, 0, 1.},
                                                {0, 2, 2.},
                                                {1, 3, 2.1}}};
  trace_and_check_collapse(f_edge_array, {{1, 3, 2.1}});
}